

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipeDensity.cpp
# Opt level: O3

void __thiscall OpenMD::PipeDensity::process(PipeDensity *this)

{
  SelectionManager *this_00;
  long *plVar1;
  vector<OpenMD::StuntDouble*,std::allocator<OpenMD::StuntDouble*>> *this_01;
  char cVar2;
  uint uVar3;
  SimInfo *info;
  Snapshot *this_02;
  pointer pvVar4;
  iterator __position;
  pointer pvVar5;
  long lVar6;
  double dVar7;
  StuntDouble *pSVar8;
  uint i_1;
  SelectionSet *pSVar9;
  uint i;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  int ii;
  StuntDouble *sd;
  Vector3d pos;
  Mat3x3d hmat;
  DumpReader reader;
  int local_1324;
  RealType local_1320;
  StuntDouble *local_1318;
  int local_130c;
  SelectionSet local_1308;
  SelectionEvaluator *local_12f0;
  ulong local_12e8;
  double local_12e0;
  double local_12d8;
  Mat3x3d local_12d0;
  DumpReader local_1288;
  
  info = (this->super_StaticAnalyser).info_;
  cVar2 = (info->simParams_->UsePeriodicBoundaryConditions).super_ParameterBase.field_0x2b;
  DumpReader::DumpReader(&local_1288,info,&(this->super_StaticAnalyser).dumpFilename_);
  local_130c = DumpReader::getNFrames(&local_1288);
  this->nProcessed_ = local_130c / (this->super_StaticAnalyser).step_;
  if (0 < local_130c) {
    local_12f0 = &this->evaluator_;
    this_00 = &this->seleMan_;
    uVar14 = 0;
    pSVar8 = local_1318;
    do {
      local_1318 = pSVar8;
      local_12e8 = uVar14;
      DumpReader::readFrame(&local_1288,(int)uVar14);
      this_02 = ((this->super_StaticAnalyser).info_)->sman_->currentSnapshot_;
      this->currentSnapshot_ = this_02;
      uVar12 = this->nBins2_;
      if ((ulong)uVar12 != 0) {
        uVar3 = (this->super_StaticAnalyser).nBins_;
        pvVar4 = (this->sliceSDLists_).
                 super__Vector_base<std::vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar14 = 0;
        do {
          if (uVar3 != 0) {
            lVar10 = *(long *)&pvVar4[uVar14].
                               super__Vector_base<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
                               ._M_impl.super__Vector_impl_data;
            lVar15 = 0;
            do {
              if (*(long *)(lVar10 + 8 + lVar15) != *(long *)(lVar10 + lVar15)) {
                *(long *)(lVar10 + 8 + lVar15) = *(long *)(lVar10 + lVar15);
              }
              lVar15 = lVar15 + 0x18;
            } while ((ulong)uVar3 * 0x18 != lVar15);
          }
          uVar14 = uVar14 + 1;
        } while (uVar14 != uVar12);
      }
      local_1320 = Snapshot::getVolume(this_02);
      uVar12 = (this->super_StaticAnalyser).nBins_;
      uVar3 = this->nBins2_;
      Snapshot::getHmat(&local_12d0,this->currentSnapshot_);
      local_12d8 = *(double *)
                    ((long)local_12d0.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>
                           .data_ + (ulong)(uint)this->axis1_ * 0x20) * 0.5;
      local_12e0 = *(double *)
                    ((long)local_12d0.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>
                           .data_ + (ulong)(uint)this->axis2_ * 0x20) * 0.5;
      if ((this->evaluator_).isDynamic_ == true) {
        SelectionEvaluator::evaluate(&local_1308,local_12f0);
        lVar10 = 0;
        do {
          std::vector<bool,_std::allocator<bool>_>::operator=
                    ((vector<bool,_std::allocator<bool>_> *)
                     ((long)&(((this->seleMan_).ss_.bitsets_.
                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                               ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                             super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                     lVar10),(vector<bool,_std::allocator<bool>_> *)
                             ((long)&((local_1308.bitsets_.
                                       super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                                     super__Bvector_base<std::allocator<bool>_>._M_impl.
                                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                             + lVar10));
          lVar10 = lVar10 + 0x28;
        } while (lVar10 != 0xf0);
        std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                  (&local_1308.bitsets_);
      }
      local_1318 = SelectionManager::beginSelected(this_00,&local_1324);
      local_1320 = local_1320 / (double)(uVar12 * uVar3);
      while (local_1318 != (StuntDouble *)0x0) {
        pSVar9 = (SelectionSet *)
                 ((long)local_1318->localIndex_ * 0x18 +
                 *(long *)((long)&(local_1318->snapshotMan_->currentSnapshot_->atomData).position.
                                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + local_1318->storage_))
        ;
        local_1308.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_1308.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_1308.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (pSVar9 != &local_1308) {
          lVar10 = 0;
          do {
            (&local_1308.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_start)[lVar10] =
                 (&(pSVar9->bitsets_).
                   super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                   _M_impl.super__Vector_impl_data._M_start)[lVar10];
            lVar10 = lVar10 + 1;
          } while (lVar10 != 3);
        }
        if (cVar2 != '\0') {
          Snapshot::wrapVector(this->currentSnapshot_,(Vector3d *)&local_1308);
        }
        pSVar9 = (SelectionSet *)
                 ((long)local_1318->localIndex_ * 0x18 +
                 *(long *)((long)&(local_1318->snapshotMan_->currentSnapshot_->atomData).position.
                                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + local_1318->storage_))
        ;
        if (pSVar9 != &local_1308) {
          lVar10 = 0;
          do {
            (&(pSVar9->bitsets_).
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_start)[lVar10] =
                 (&local_1308.bitsets_.
                   super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                   _M_impl.super__Vector_impl_data._M_start)[lVar10];
            lVar10 = lVar10 + 1;
          } while (lVar10 != 3);
        }
        local_1318 = SelectionManager::nextSelected(this_00,&local_1324);
      }
      local_1318 = SelectionManager::beginSelected(this_00,&local_1324);
      while (local_1318 != (StuntDouble *)0x0) {
        lVar10 = *(long *)((long)&(local_1318->snapshotMan_->currentSnapshot_->atomData).position.
                                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + local_1318->storage_);
        local_1308.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             *(pointer *)(lVar10 + 0x10 + (long)local_1318->localIndex_ * 0x18);
        plVar1 = (long *)(lVar10 + (long)local_1318->localIndex_ * 0x18);
        local_1308.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)*plVar1;
        local_1308.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)plVar1[1];
        this_01 = (vector<OpenMD::StuntDouble*,std::allocator<OpenMD::StuntDouble*>> *)
                  (*(long *)&(this->sliceSDLists_).
                             super__Vector_base<std::vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start
                             [(int)((((double)(&local_1308.bitsets_.
                                                super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                                ._M_impl.super__Vector_impl_data._M_start)
                                              [(uint)this->axis1_] + local_12d8) *
                                    (double)this->nBins2_) /
                                   *(double *)
                                    ((long)local_12d0.super_SquareMatrix<double,_3>.
                                           super_RectMatrix<double,_3U,_3U>.data_ +
                                    (ulong)(uint)this->axis1_ * 0x20))].
                             super__Vector_base<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
                             ._M_impl.super__Vector_impl_data +
                  (long)(int)((((double)(&local_1308.bitsets_.
                                          super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                          ._M_impl.super__Vector_impl_data._M_start)
                                        [(uint)this->axis2_] + local_12e0) *
                              (double)(this->super_StaticAnalyser).nBins_) /
                             *(double *)
                              ((long)local_12d0.super_SquareMatrix<double,_3>.
                                     super_RectMatrix<double,_3U,_3U>.data_ +
                              (ulong)(uint)this->axis2_ * 0x20)) * 0x18);
        __position._M_current = *(StuntDouble ***)(this_01 + 8);
        if (__position._M_current == *(StuntDouble ***)(this_01 + 0x10)) {
          std::vector<OpenMD::StuntDouble*,std::allocator<OpenMD::StuntDouble*>>::
          _M_realloc_insert<OpenMD::StuntDouble*const&>(this_01,__position,&local_1318);
        }
        else {
          *__position._M_current = local_1318;
          *(long *)(this_01 + 8) = *(long *)(this_01 + 8) + 8;
        }
        local_1318 = SelectionManager::nextSelected(this_00,&local_1324);
      }
      uVar12 = this->nBins2_;
      if ((ulong)uVar12 != 0) {
        uVar14 = (ulong)(this->super_StaticAnalyser).nBins_;
        pvVar4 = (this->sliceSDLists_).
                 super__Vector_base<std::vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pvVar5 = (this->density_).
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar13 = 0;
        do {
          if (uVar14 != 0) {
            lVar10 = *(long *)&pvVar4[uVar13].
                               super__Vector_base<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
                               ._M_impl.super__Vector_impl_data;
            lVar15 = *(long *)&pvVar5[uVar13].super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data;
            uVar16 = 0;
            do {
              lVar6 = *(long *)(lVar10 + uVar16 * 0x18);
              lVar17 = *(long *)(lVar10 + 8 + uVar16 * 0x18) - lVar6;
              if (lVar17 == 0) {
                dVar7 = 0.0;
              }
              else {
                dVar7 = 0.0;
                uVar11 = 0;
                do {
                  dVar7 = dVar7 + *(double *)(*(long *)(lVar6 + uVar11 * 8) + 0x38);
                  uVar11 = uVar11 + 1;
                } while ((uVar11 & 0xffffffff) < (ulong)(lVar17 >> 3));
              }
              *(double *)(lVar15 + uVar16 * 8) =
                   dVar7 / local_1320 + *(double *)(lVar15 + uVar16 * 8);
              uVar16 = uVar16 + 1;
            } while (uVar16 != uVar14);
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 != uVar12);
      }
      uVar12 = (int)local_12e8 + (this->super_StaticAnalyser).step_;
      uVar14 = (ulong)uVar12;
      local_1318 = (StuntDouble *)0x0;
      pSVar8 = (StuntDouble *)0x0;
    } while ((int)uVar12 < local_130c);
  }
  (*(this->super_StaticAnalyser)._vptr_StaticAnalyser[4])(this);
  DumpReader::~DumpReader(&local_1288);
  return;
}

Assistant:

void PipeDensity::process() {
    StuntDouble* sd;
    int ii;

    bool usePeriodicBoundaryConditions_ =
        info_->getSimParams()->getUsePeriodicBoundaryConditions();

    DumpReader reader(info_, dumpFilename_);
    int nFrames = reader.getNFrames();
    nProcessed_ = nFrames / step_;

    for (int istep = 0; istep < nFrames; istep += step_) {
      reader.readFrame(istep);
      currentSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();

      for (unsigned int i = 0; i < nBins2_; i++) {
        for (unsigned int j = 0; j < nBins_; j++) {
          sliceSDLists_[i][j].clear();
        }
      }

      RealType sliceVolume = currentSnapshot_->getVolume() / (nBins2_ * nBins_);
      Mat3x3d hmat         = currentSnapshot_->getHmat();

      RealType halfBox1_ = hmat(axis1_, axis1_) / 2.0;
      RealType halfBox2_ = hmat(axis2_, axis2_) / 2.0;

      if (evaluator_.isDynamic()) {
        seleMan_.setSelectionSet(evaluator_.evaluate());
      }

      // wrap the stuntdoubles into a cell
      for (sd = seleMan_.beginSelected(ii); sd != NULL;
           sd = seleMan_.nextSelected(ii)) {
        Vector3d pos = sd->getPos();
        if (usePeriodicBoundaryConditions_) currentSnapshot_->wrapVector(pos);
        sd->setPos(pos);
      }

      // determine which atom belongs to which slice
      for (sd = seleMan_.beginSelected(ii); sd != NULL;
           sd = seleMan_.nextSelected(ii)) {
        Vector3d pos = sd->getPos();
        // shift molecules by half a box to have bins start at 0
        int binNo1 =
            int(nBins2_ * (halfBox1_ + pos[axis1_]) / hmat(axis1_, axis1_));
        int binNo2 =
            int(nBins_ * (halfBox2_ + pos[axis2_]) / hmat(axis2_, axis2_));
        sliceSDLists_[binNo1][binNo2].push_back(sd);
      }

      // loop over the slices to calculate the densities
      for (unsigned int i = 0; i < nBins2_; i++) {
        for (unsigned int j = 0; j < nBins_; j++) {
          RealType totalMass = 0;
          for (unsigned int k = 0; k < sliceSDLists_[i][j].size(); ++k) {
            totalMass += sliceSDLists_[i][j][k]->getMass();
          }
          density_[i][j] += totalMass / sliceVolume;
        }
      }
    }

    writeDensity();
  }